

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O0

uint Validator::constraintS3(Solution *solution)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *this;
  reference ppVar5;
  Nurse *pNVar6;
  History *this_00;
  vector<Turn_*,_std::allocator<Turn_*>_> *this_01;
  reference ppTVar7;
  Scenario *pSVar8;
  string *psVar9;
  string local_1f8;
  Contract local_1d8;
  string local_198;
  Contract local_178;
  string local_138;
  Contract local_118;
  string local_c8;
  Contract local_a8;
  int local_68;
  int local_64;
  int CDays;
  int currentDay;
  Turn *turn;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  int lastDay;
  int numberOfConsecutiveDaysOff;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
  *nurse;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__range1;
  uint sum;
  Solution *solution_local;
  
  __range1._4_4_ = 0;
  this = Solution::getNurses_abi_cxx11_(solution);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
           ::begin(this);
  nurse = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
             ::end(this);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&nurse), bVar1) {
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
             ::operator*(&__end1);
    pNVar6 = NurseSolution::getNurse(ppVar5->second);
    this_00 = Nurse::getHistory(pNVar6);
    iVar2 = History::getNumberOfConsecutiveDaysOff(this_00);
    __range2._0_4_ = -(iVar2 + 1);
    this_01 = NurseSolution::getTurns(ppVar5->second);
    __end2 = std::vector<Turn_*,_std::allocator<Turn_*>_>::begin(this_01);
    turn = (Turn *)std::vector<Turn_*,_std::allocator<Turn_*>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>
                                       *)&turn), bVar1) {
      ppTVar7 = __gnu_cxx::
                __normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
                operator*(&__end2);
      _CDays = *ppTVar7;
      local_64 = Turn::getDay(_CDays);
      iVar2 = local_64 - ((int)__range2 + 1);
      local_68 = iVar2;
      if (iVar2 != 0) {
        pSVar8 = Scenario::getInstance();
        pNVar6 = NurseSolution::getNurse(ppVar5->second);
        psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
        std::__cxx11::string::string((string *)&local_c8,(string *)psVar9);
        Scenario::getContract(&local_a8,pSVar8,&local_c8);
        iVar3 = Contract::getMinimumNumberOfConsecutiveDaysOff(&local_a8);
        Contract::~Contract(&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        iVar4 = local_68;
        if (iVar2 < iVar3) {
          pSVar8 = Scenario::getInstance();
          pNVar6 = NurseSolution::getNurse(ppVar5->second);
          psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
          std::__cxx11::string::string((string *)&local_138,(string *)psVar9);
          Scenario::getContract(&local_118,pSVar8,&local_138);
          iVar2 = Contract::getMinimumNumberOfConsecutiveDaysOff(&local_118);
          __range1._4_4_ = (iVar2 - local_68) * 0x1e + __range1._4_4_;
          Contract::~Contract(&local_118);
          std::__cxx11::string::~string((string *)&local_138);
        }
        else {
          pSVar8 = Scenario::getInstance();
          pNVar6 = NurseSolution::getNurse(ppVar5->second);
          psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
          std::__cxx11::string::string((string *)&local_198,(string *)psVar9);
          Scenario::getContract(&local_178,pSVar8,&local_198);
          iVar3 = Contract::getMaximumNumberOfConsecutiveDaysOff(&local_178);
          Contract::~Contract(&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          iVar2 = local_68;
          if (iVar3 < iVar4) {
            pSVar8 = Scenario::getInstance();
            pNVar6 = NurseSolution::getNurse(ppVar5->second);
            psVar9 = Nurse::getContract_abi_cxx11_(pNVar6);
            std::__cxx11::string::string((string *)&local_1f8,(string *)psVar9);
            Scenario::getContract(&local_1d8,pSVar8,&local_1f8);
            iVar4 = Contract::getMaximumNumberOfConsecutiveDaysOff(&local_1d8);
            __range1._4_4_ = (iVar2 - iVar4) * 0x1e + __range1._4_4_;
            Contract::~Contract(&local_1d8);
            std::__cxx11::string::~string((string *)&local_1f8);
          }
        }
      }
      __range2._0_4_ = Turn::getDay(_CDays);
      __gnu_cxx::__normal_iterator<Turn_*const_*,_std::vector<Turn_*,_std::allocator<Turn_*>_>_>::
      operator++(&__end2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>
    ::operator++(&__end1);
  }
  return __range1._4_4_;
}

Assistant:

unsigned int Validator::constraintS3(const Solution &solution) {

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int numberOfConsecutiveDaysOff = nurse.second->getNurse()->getHistory().getNumberOfConsecutiveDaysOff();

        int lastDay = - (numberOfConsecutiveDaysOff + 1);

        for(Turn * turn : nurse.second->getTurns())
        {
            int currentDay = turn->getDay();

            int CDays = currentDay - (lastDay + 1);

            if (CDays != 0) {
                if(CDays < Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMinimumNumberOfConsecutiveDaysOff())
                {
                    sum += 30 * (Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMinimumNumberOfConsecutiveDaysOff() - CDays);
                }
                else if (CDays > Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfConsecutiveDaysOff())
                {
                    sum += 30 * (CDays - Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfConsecutiveDaysOff());
                }
            }

            lastDay = turn->getDay();
        }
    }

    return sum;
}